

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_point_read_string(mbedtls_ecp_point *P,int radix,char *x,char *y)

{
  int local_2c;
  int ret;
  char *y_local;
  char *x_local;
  int radix_local;
  mbedtls_ecp_point *P_local;
  
  local_2c = mbedtls_mpi_read_string(&P->X,radix,x);
  if ((local_2c == 0) && (local_2c = mbedtls_mpi_read_string(&P->Y,radix,y), local_2c == 0)) {
    local_2c = mbedtls_mpi_lset(&P->Z,1);
  }
  return local_2c;
}

Assistant:

int mbedtls_ecp_point_read_string(mbedtls_ecp_point *P, int radix,
                                  const char *x, const char *y)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_mpi_read_string(&P->X, radix, x));
    MBEDTLS_MPI_CHK(mbedtls_mpi_read_string(&P->Y, radix, y));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&P->Z, 1));

cleanup:
    return ret;
}